

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testSourceInsertCol_data(tst_InsertProxyModel *this)

{
  initializer_list<std::pair<int,_QByteArray>_> *piVar1;
  char *pcVar2;
  QTestData *pQVar3;
  pair<bool,_QByteArray> *local_690;
  pair<int,_QByteArray> *local_658;
  pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> *local_5d8;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> *local_5a0;
  QAbstractItemModel *local_560;
  QByteArray local_558;
  QByteArray local_540;
  QByteArray local_528;
  QByteArray local_510;
  QByteArray local_4f8;
  QByteArray local_4e0;
  const_iterator local_4c8;
  pair<bool,_QByteArray> *addViaProxy;
  const_iterator __end5;
  const_iterator __begin5;
  QArrayDataPointer<char> local_4a8;
  QByteArray local_490;
  bool local_471;
  QArrayDataPointer<char> local_470;
  QByteArray local_458;
  bool local_439;
  pair<bool,_QByteArray> *local_438;
  pair<bool,_QByteArray> local_430;
  pair<bool,_QByteArray> local_410;
  pair<bool,_QByteArray> *local_3f0;
  Data *local_3e8;
  initializer_list<std::pair<bool,_QByteArray>_> *local_3e0;
  initializer_list<std::pair<bool,_QByteArray>_> *__range5;
  pair<int,_QByteArray> *indexToInsert;
  const_iterator __end4;
  const_iterator __begin4;
  QArrayDataPointer<char> local_3b8;
  QByteArray local_3a0;
  QModelIndex local_388;
  int local_36c;
  QArrayDataPointer<char> local_368;
  QByteArray local_350;
  QModelIndex local_338;
  int local_31c;
  QArrayDataPointer<char> local_318;
  QByteArray local_300;
  int local_2e4;
  pair<int,_QByteArray> *local_2e0;
  pair<int,_QByteArray> local_2d8;
  pair<int,_QByteArray> local_2b8;
  pair<int,_QByteArray> local_298;
  pair<int,_QByteArray> *local_278;
  Data *local_270;
  initializer_list<std::pair<int,_QByteArray>_> *local_268;
  initializer_list<std::pair<int,_QByteArray>_> *__range4;
  QAbstractItemModel *tempModel;
  pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> *baseModel;
  const_iterator __end2;
  const_iterator __begin2;
  QArrayDataPointer<char> local_238;
  QByteArray local_220;
  _func_QAbstractItemModel_ptr_QObject_ptr *local_208;
  QArrayDataPointer<char> local_200;
  QByteArray local_1e8;
  _func_QAbstractItemModel_ptr_QObject_ptr *local_1d0;
  pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> *local_1c8;
  pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> local_1c0;
  pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> local_1a0;
  pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> *local_180;
  Data *local_178;
  initializer_list<std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>_> *local_170;
  initializer_list<std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>_> *__range2;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> *insertDirection;
  const_iterator local_158;
  const_iterator __end1;
  const_iterator __begin1;
  QArrayDataPointer<char> local_140;
  QByteArray local_128;
  QFlags<InsertProxyModel::InsertDirection> local_10c;
  QArrayDataPointer<char> local_108;
  QByteArray local_f0;
  QFlags<InsertProxyModel::InsertDirection> local_d8 [4];
  QArrayDataPointer<char> local_c8;
  QByteArray local_b0;
  QFlags<InsertProxyModel::InsertDirection> local_94;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> *local_90;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> local_88;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> local_68;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> local_48;
  pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> *local_28;
  Data *local_20;
  initializer_list<std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>_> *local_18;
  initializer_list<std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>_> *__range1;
  tst_InsertProxyModel *this_local;
  
  __range1 = (initializer_list<std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>_> *)
             this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QFlags<InsertProxyModel::InsertDirection>>
            ("insertDirection",(QFlags<InsertProxyModel::InsertDirection> *)0x0);
  QTest::addColumn<int>("indexToInsert",(int *)0x0);
  QTest::addColumn<bool>("addViaProxy",(bool *)0x0);
  __begin1._7_1_ = 1;
  local_90 = &local_88;
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_94,InsertRow);
  QArrayDataPointer<char>::QArrayDataPointer(&local_c8,(Data *)0x0,"Extra Row",9);
  QByteArray::QByteArray(&local_b0,&local_c8);
  std::make_pair<QFlags<InsertProxyModel::InsertDirection>,QByteArray>
            (&local_88,&local_94,&local_b0);
  local_90 = &local_68;
  QFlags<InsertProxyModel::InsertDirection>::QFlags(local_d8,InsertColumn);
  QArrayDataPointer<char>::QArrayDataPointer(&local_108,(Data *)0x0,"Extra Column",0xc);
  QByteArray::QByteArray(&local_f0,&local_108);
  std::make_pair<QFlags<InsertProxyModel::InsertDirection>,QByteArray>(&local_68,local_d8,&local_f0)
  ;
  local_90 = &local_48;
  local_10c = operator|(InsertColumn,InsertRow);
  QArrayDataPointer<char>::QArrayDataPointer(&local_140,(Data *)0x0,"Extra Row and Column",0x14);
  QByteArray::QByteArray(&local_128,&local_140);
  std::make_pair<QFlags<InsertProxyModel::InsertDirection>,QByteArray>
            (&local_48,&local_10c,&local_128);
  __begin1._7_1_ = 0;
  local_28 = &local_88;
  local_20 = (Data *)0x3;
  QByteArray::~QByteArray(&local_128);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_140);
  QByteArray::~QByteArray(&local_f0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
  QByteArray::~QByteArray(&local_b0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  local_18 = (initializer_list<std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>_> *)
             &stack0xffffffffffffffd8;
  __end1 = std::initializer_list<std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>_>
           ::begin(local_18);
  local_158 = std::
              initializer_list<std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>_>::
              end(local_18);
  for (; __end1 != local_158; __end1 = __end1 + 1) {
    __range2 = (initializer_list<std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>_> *)
               __end1;
    __begin2._7_1_ = 1;
    local_1c8 = &local_1c0;
    local_1d0 = createTableModel;
    QArrayDataPointer<char>::QArrayDataPointer(&local_200,(Data *)0x0,"Table",5);
    QByteArray::QByteArray(&local_1e8,&local_200);
    std::make_pair<QAbstractItemModel*(*)(QObject*),QByteArray>(&local_1c0,&local_1d0,&local_1e8);
    local_208 = createTreeModel;
    local_1c8 = &local_1a0;
    QArrayDataPointer<char>::QArrayDataPointer(&local_238,(Data *)0x0,"Tree",4);
    QByteArray::QByteArray(&local_220,&local_238);
    std::make_pair<QAbstractItemModel*(*)(QObject*),QByteArray>(&local_1a0,&local_208,&local_220);
    __begin2._7_1_ = 0;
    local_180 = &local_1c0;
    local_178 = (Data *)0x2;
    QByteArray::~QByteArray(&local_220);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_238);
    QByteArray::~QByteArray(&local_1e8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_200);
    local_170 = (initializer_list<std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>_> *)
                &stack0xfffffffffffffe80;
    __end2 = std::initializer_list<std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>_>::
             begin(local_170);
    baseModel = std::initializer_list<std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>_>::
                end(local_170);
    for (; __end2 != baseModel; __end2 = __end2 + 1) {
      tempModel = (QAbstractItemModel *)__end2;
      __range4 = (initializer_list<std::pair<int,_QByteArray>_> *)
                 (*__end2->first)(&this->super_QObject);
      if (__range4 != (initializer_list<std::pair<int,_QByteArray>_> *)0x0) {
        __begin4._7_1_ = 1;
        local_2e0 = &local_2d8;
        local_2e4 = 0;
        QArrayDataPointer<char>::QArrayDataPointer(&local_318,(Data *)0x0,"Begin",5);
        QByteArray::QByteArray(&local_300,&local_318);
        std::make_pair<int,QByteArray>(&local_2d8,&local_2e4,&local_300);
        piVar1 = __range4;
        local_2e0 = &local_2b8;
        QModelIndex::QModelIndex(&local_338);
        local_31c = (**(code **)(piVar1->_M_array + 4))(piVar1,&local_338);
        QArrayDataPointer<char>::QArrayDataPointer(&local_368,(Data *)0x0,"End",3);
        QByteArray::QByteArray(&local_350,&local_368);
        std::make_pair<int,QByteArray>(&local_2b8,&local_31c,&local_350);
        piVar1 = __range4;
        local_2e0 = &local_298;
        QModelIndex::QModelIndex(&local_388);
        local_36c = (**(code **)(piVar1->_M_array + 4))(piVar1,&local_388);
        local_36c = local_36c / 2;
        QArrayDataPointer<char>::QArrayDataPointer(&local_3b8,(Data *)0x0,"Middle",6);
        QByteArray::QByteArray(&local_3a0,&local_3b8);
        std::make_pair<int,QByteArray>(&local_298,&local_36c,&local_3a0);
        __begin4._7_1_ = 0;
        local_278 = &local_2d8;
        local_270 = (Data *)0x3;
        QByteArray::~QByteArray(&local_3a0);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_3b8);
        QByteArray::~QByteArray(&local_350);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_368);
        QByteArray::~QByteArray(&local_300);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_318);
        local_268 = (initializer_list<std::pair<int,_QByteArray>_> *)&stack0xfffffffffffffd88;
        __end4 = std::initializer_list<std::pair<int,_QByteArray>_>::begin(local_268);
        indexToInsert = std::initializer_list<std::pair<int,_QByteArray>_>::end(local_268);
        for (; __end4 != indexToInsert; __end4 = __end4 + 1) {
          __range5 = (initializer_list<std::pair<bool,_QByteArray>_> *)__end4;
          __begin5._7_1_ = 1;
          local_438 = &local_430;
          local_439 = true;
          QArrayDataPointer<char>::QArrayDataPointer(&local_470,(Data *)0x0,"via Proxy",9);
          QByteArray::QByteArray(&local_458,&local_470);
          std::make_pair<bool,QByteArray>(&local_430,&local_439,&local_458);
          local_471 = false;
          local_438 = &local_410;
          QArrayDataPointer<char>::QArrayDataPointer(&local_4a8,(Data *)0x0,"via Base",8);
          QByteArray::QByteArray(&local_490,&local_4a8);
          std::make_pair<bool,QByteArray>(&local_410,&local_471,&local_490);
          __begin5._7_1_ = 0;
          local_3f0 = &local_430;
          local_3e8 = (Data *)0x2;
          QByteArray::~QByteArray(&local_490);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_4a8);
          QByteArray::~QByteArray(&local_458);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_470);
          local_3e0 = (initializer_list<std::pair<bool,_QByteArray>_> *)&stack0xfffffffffffffc10;
          __end5 = std::initializer_list<std::pair<bool,_QByteArray>_>::begin(local_3e0);
          addViaProxy = std::initializer_list<std::pair<bool,_QByteArray>_>::end(local_3e0);
          for (; __end5 != addViaProxy; __end5 = __end5 + 1) {
            local_4c8 = __end5;
            operator+(&local_558,(QByteArray *)(tempModel + 8),' ');
            operator+(&local_540,&local_558,(QByteArray *)&__range2->_M_len);
            operator+(&local_528,&local_540,' ');
            operator+(&local_510,&local_528,&local_4c8->second);
            operator+(&local_4f8,&local_510,' ');
            operator+(&local_4e0,&local_4f8,(QByteArray *)&__range5->_M_len);
            pcVar2 = QByteArray::constData(&local_4e0);
            pQVar3 = (QTestData *)QTest::newRow(pcVar2);
            local_560 = (QAbstractItemModel *)(**(code **)tempModel)(this);
            pQVar3 = ::operator<<(pQVar3,&local_560);
            pQVar3 = ::operator<<(pQVar3,(QFlags<InsertProxyModel::InsertDirection> *)__range2);
            pQVar3 = ::operator<<(pQVar3,(int *)__range5);
            ::operator<<(pQVar3,&local_4c8->first);
            QByteArray::~QByteArray(&local_4e0);
            QByteArray::~QByteArray(&local_4f8);
            QByteArray::~QByteArray(&local_510);
            QByteArray::~QByteArray(&local_528);
            QByteArray::~QByteArray(&local_540);
            QByteArray::~QByteArray(&local_558);
          }
          insertDirection._4_4_ = 8;
          local_690 = (pair<bool,_QByteArray> *)&stack0xfffffffffffffc10;
          do {
            local_690 = local_690 + -1;
            std::pair<bool,_QByteArray>::~pair(local_690);
          } while (local_690 != &local_430);
        }
        insertDirection._4_4_ = 6;
        local_658 = (pair<int,_QByteArray> *)&stack0xfffffffffffffd88;
        do {
          local_658 = local_658 + -1;
          std::pair<int,_QByteArray>::~pair(local_658);
        } while (local_658 != &local_2d8);
        QObject::deleteLater();
      }
    }
    insertDirection._4_4_ = 4;
    local_5d8 = (pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray> *)&stack0xfffffffffffffe80;
    do {
      local_5d8 = local_5d8 + -1;
      std::pair<QAbstractItemModel_*(*)(QObject_*),_QByteArray>::~pair(local_5d8);
    } while (local_5d8 != &local_1c0);
  }
  insertDirection._4_4_ = 2;
  local_5a0 = (pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray> *)
              &stack0xffffffffffffffd8;
  do {
    local_5a0 = local_5a0 + -1;
    std::pair<QFlags<InsertProxyModel::InsertDirection>,_QByteArray>::~pair(local_5a0);
  } while (local_5a0 != &local_88);
  return;
}

Assistant:

void tst_InsertProxyModel::testSourceInsertCol_data()
{

    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<InsertProxyModel::InsertDirections>("insertDirection");
    QTest::addColumn<int>("indexToInsert");
    QTest::addColumn<bool>("addViaProxy");

    for (auto &&insertDirection :
         {std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertRow, QByteArrayLiteral("Extra Row")),
          std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertColumn, QByteArrayLiteral("Extra Column")),
          std::make_pair<InsertProxyModel::InsertDirections, QByteArray>(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow,
                                                                         QByteArrayLiteral("Extra Row and Column"))}) {

        for (auto &&baseModel :
             {std::make_pair(&createTableModel, QByteArrayLiteral("Table")), std::make_pair(&createTreeModel, QByteArrayLiteral("Tree"))}) {
            QAbstractItemModel *const tempModel = baseModel.first(this);
            if (tempModel) {
                for (auto &&indexToInsert :
                     {std::make_pair(0, QByteArrayLiteral("Begin")), std::make_pair(tempModel->columnCount(), QByteArrayLiteral("End")),
                      std::make_pair(tempModel->columnCount() / 2, QByteArrayLiteral("Middle"))}) {
                    for (auto &&addViaProxy :
                         {std::make_pair(true, QByteArrayLiteral("via Proxy")), std::make_pair(false, QByteArrayLiteral("via Base"))}) {
                        QTest::newRow(
                                (baseModel.second + ' ' + insertDirection.second + ' ' + addViaProxy.second + ' ' + indexToInsert.second).constData())
                                << baseModel.first(this) << insertDirection.first << indexToInsert.first << addViaProxy.first;
                    }
                }
                tempModel->deleteLater();
            }
        }
    }
}